

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O0

int CTcPrsOpUnary::parse_embedded_end_tok(CTcEmbedBuilder *b,CTcEmbedLevel *parent,char **open_kw)

{
  int iVar1;
  CTcEmbedTokenList *in_RDX;
  CTcEmbedTokenList *in_RDI;
  int ret;
  CTcEmbedTokenList *unaff_retaddr;
  CTcEmbedTokenList *tl;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  CTcEmbedTokenList *this;
  
  this = G_prs->embed_toks_;
  CTcEmbedTokenList::reset(this);
  capture_embedded((CTcEmbedBuilder *)unaff_retaddr,in_RDI);
  iVar1 = parse_embedded_end_tok
                    (in_RDX,(CTcEmbedLevel *)this,
                     (char **)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  CTcEmbedTokenList::unget(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return iVar1;
}

Assistant:

int CTcPrsOpUnary::parse_embedded_end_tok(CTcEmbedBuilder *b,
                                          CTcEmbedLevel *parent,
                                          const char **open_kw)
{
    /* capture the current expression's token list */
    CTcEmbedTokenList *tl = G_prs->embed_toks_;
    tl->reset();
    capture_embedded(b, tl);

    /* parse the end token */
    int ret = parse_embedded_end_tok(tl, parent, open_kw);

    /* un-get the captured tokens */
    tl->unget();

    /* return the result */
    return ret;
}